

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.cpp
# Opt level: O0

int __thiscall HashTable<int>::Find(HashTable<int> *this,int value)

{
  int iVar1;
  node *local_30;
  Node *p;
  int local_20;
  int address;
  int count;
  int value_local;
  HashTable<int> *this_local;
  
  local_20 = 1;
  iVar1 = GetHashAddress(this,value);
  if (this->HashArray[iVar1].value == value) {
    this_local._4_4_ = 1;
  }
  else {
    for (local_30 = this->HashArray[iVar1].next; local_30 != (node *)0x0; local_30 = local_30->next)
    {
      local_20 = local_20 + 1;
      if (local_30->value == value) {
        return local_20;
      }
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Find(DataType value) {
		int count = 1;
		int address = GetHashAddress(value);
		if (HashArray[address].value == value)
			return count;
		else {
			Node *p = HashArray[address].next;
			while (p != NULL) {
				count++;
				if (p->value == value)
					return count;
				p = p->next;
			}
		}
		return 0;   //没找到
	}